

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O0

void XCore_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  cs_detail *pcVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_short i;
  uint id_local;
  cs_insn *insn_local;
  cs_struct *h_local;
  
  uVar2 = insn_find(insns,0xd7,id,&h->insn_cache);
  if ((uVar2 != 0) && (insn->id = (uint)insns[uVar2].mapid, h->detail != CS_OPT_OFF)) {
    pcVar1 = insn->detail;
    *(undefined8 *)pcVar1->regs_read = *(undefined8 *)insns[uVar2].regs_use;
    *(undefined4 *)(pcVar1->regs_read + 8) = *(undefined4 *)(insns[uVar2].regs_use + 8);
    uVar3 = count_positive(insns[uVar2].regs_use);
    insn->detail->regs_read_count = (uint8_t)uVar3;
    pcVar1 = insn->detail;
    *(undefined8 *)pcVar1->regs_write = *(undefined8 *)insns[uVar2].regs_mod;
    *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[uVar2].regs_mod + 8);
    *(undefined4 *)(pcVar1->regs_write + 0x10) = *(undefined4 *)(insns[uVar2].regs_mod + 0x10);
    uVar3 = count_positive(insns[uVar2].regs_mod);
    insn->detail->regs_write_count = (uint8_t)uVar3;
    *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[uVar2].groups;
    uVar3 = count_positive(insns[uVar2].groups);
    insn->detail->groups_count = (uint8_t)uVar3;
    if (((insns[uVar2].branch & 1U) != 0) || ((insns[uVar2].indirect_branch & 1U) != 0)) {
      insn->detail->groups[insn->detail->groups_count] = '\x01';
      insn->detail->groups_count = insn->detail->groups_count + '\x01';
    }
  }
  return;
}

Assistant:

void XCore_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned short i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = XCORE_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
		}
	}
}